

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O2

void i2c_detect_devices(int bus)

{
  mraa_result_t mVar1;
  long lVar2;
  uint uVar3;
  uint8_t value;
  
  lVar2 = mraa_i2c_init();
  if (lVar2 != 0) {
    uVar3 = 0;
    while (uVar3 != 0x80) {
      if ((uVar3 & 0xf) == 0) {
        printf("%02x: ",(ulong)uVar3);
      }
      mVar1 = i2c_get(bus,(uint8_t)uVar3,'\0',&value);
      if (mVar1 == MRAA_SUCCESS) {
        printf("%02x ",(ulong)uVar3);
      }
      else {
        printf("-- ");
      }
      uVar3 = uVar3 + 1;
      if ((uVar3 & 0xf) == 0) {
        putchar(10);
      }
    }
  }
  return;
}

Assistant:

void
i2c_detect_devices(int bus)
{
    mraa_i2c_context i2c = mraa_i2c_init(bus);
    if (i2c == NULL) {
        return;
    }
    int addr;
    for (addr = 0x0; addr < 0x80; ++addr) {
        uint8_t value;
        if ((addr) % 16 == 0)
            printf("%02x: ", addr);
        if (i2c_get(bus, addr, 0, &value) == MRAA_SUCCESS)
            printf("%02x ", addr);
        else
            printf("-- ");
        if ((addr + 1) % 16 == 0)
            printf("\n");
    }
}